

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall TPZMatrix<int>::Decompose_LU(TPZMatrix<int> *this)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int64_t j;
  long lVar5;
  long lVar6;
  long lVar7;
  int nn;
  int local_48;
  int local_44;
  long local_40;
  long local_38;
  
  bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if (1 < bVar1) {
    Error("Decompose_LU <Matrix already Decomposed with other scheme>",(char *)0x0);
    bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (bVar1 == 0) {
    local_38 = (this->super_TPZBaseMatrix).fRow;
    lVar5 = (this->super_TPZBaseMatrix).fCol;
    if (lVar5 < local_38) {
      local_38 = lVar5;
    }
    lVar5 = 0;
    if (local_38 < 1) {
      local_38 = lVar5;
    }
    while (lVar6 = lVar5, lVar6 != local_38) {
      local_48 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                           (this,lVar6,lVar6);
      if (local_48 == 0) {
        Error("Decompose_LU <matrix is singular>",(char *)0x0);
      }
      lVar7 = lVar6 + 1;
      local_40 = lVar7;
      for (; lVar5 = local_40, lVar7 < (this->super_TPZBaseMatrix).fRow; lVar7 = lVar7 + 1) {
        iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar7,lVar6);
        nn = iVar2 / local_48;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(this,lVar7,lVar6,&nn)
        ;
        for (lVar5 = local_40; lVar5 < (this->super_TPZBaseMatrix).fCol; lVar5 = lVar5 + 1) {
          iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                            (this,lVar7,lVar5);
          iVar2 = nn;
          iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                            (this,lVar6,lVar5);
          local_44 = iVar3 - iVar4 * iVar2;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar7,lVar5,&local_44);
        }
      }
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}